

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::GetRML(Element *this,String *content)

{
  bool bVar1;
  reference __lhs;
  PropertyMap *this_00;
  String *pSVar2;
  undefined1 *puVar3;
  String local_100;
  String local_e0;
  Property *local_c0;
  Property *property;
  reference ppStack_b0;
  PropertyId id;
  pair<Rml::PropertyId,_Rml::Property> *pair_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  PropertyMap *__range1_1;
  PropertyMap *local_properties;
  undefined1 local_68 [8];
  String value;
  Variant *variant;
  String *name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *pair;
  iterator __end1;
  iterator __begin1;
  ElementAttributes *__range1;
  String *content_local;
  Element *this_local;
  
  ::std::__cxx11::string::operator+=((string *)content,"<");
  ::std::__cxx11::string::operator+=((string *)content,(string *)&this->tag);
  __end1 = itlib::
           flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
           ::begin(&this->attributes);
  pair = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
          *)itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::end(&this->attributes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                                     *)&pair), bVar1) {
    __lhs = __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::operator*(&__end1);
    bVar1 = ::std::operator==(&__lhs->first,"style");
    if (!bVar1) {
      value.field_2._8_8_ = &__lhs->second;
      ::std::__cxx11::string::string((string *)local_68);
      bVar1 = Variant::
              GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((Variant *)value.field_2._8_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68);
      if (bVar1) {
        ::std::__cxx11::string::operator+=((string *)content,' ');
        ::std::__cxx11::string::operator+=((string *)content,(string *)__lhs);
        ::std::__cxx11::string::operator+=((string *)content,"=\"");
        ::std::__cxx11::string::operator+=((string *)content,(string *)local_68);
        ::std::__cxx11::string::operator+=((string *)content,"\"");
      }
      ::std::__cxx11::string::~string((string *)local_68);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::operator++(&__end1);
  }
  this_00 = ElementStyle::GetLocalStyleProperties(&this->meta->style);
  bVar1 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::empty(this_00);
  if (!bVar1) {
    ::std::__cxx11::string::operator+=((string *)content," style=\"");
  }
  join_0x00000010_0x00000000_ =
       robin_hood::detail::
       Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
       ::begin(this_00);
  _pair_1 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::end(this_00);
  while (bVar1 = robin_hood::detail::
                 Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
                 ::Iter<true>::operator!=((Iter<true> *)&__end1_1.mInfo,(Iter<true> *)&pair_1),
        bVar1) {
    ppStack_b0 = robin_hood::detail::
                 Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 ::Iter<true>::operator*((Iter<true> *)&__end1_1.mInfo);
    property._7_1_ = ppStack_b0->first;
    local_c0 = &ppStack_b0->second;
    pSVar2 = StyleSheetSpecification::GetPropertyName_abi_cxx11_(property._7_1_);
    ::std::__cxx11::string::operator+=((string *)content,(string *)pSVar2);
    ::std::__cxx11::string::operator+=((string *)content,": ");
    Property::ToString_abi_cxx11_(&local_100,local_c0);
    StringUtilities::EncodeRml(&local_e0,&local_100);
    ::std::__cxx11::string::operator+=((string *)content,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::operator+=((string *)content,"; ");
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++((Iter<true> *)&__end1_1.mInfo);
  }
  bVar1 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::empty(this_00);
  if (!bVar1) {
    puVar3 = (undefined1 *)::std::__cxx11::string::back();
    *puVar3 = 0x22;
  }
  bVar1 = HasChildNodes(this);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)content,">");
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[8])(this,content);
    ::std::__cxx11::string::operator+=((string *)content,"</");
    ::std::__cxx11::string::operator+=((string *)content,(string *)&this->tag);
    ::std::__cxx11::string::operator+=((string *)content,">");
  }
  else {
    ::std::__cxx11::string::operator+=((string *)content," />");
  }
  return;
}

Assistant:

void Element::GetRML(String& content)
{
	// First we start the open tag, add the attributes then close the open tag.
	// Then comes the children in order, then we add our close tag.
	content += "<";
	content += tag;

	for (auto& pair : attributes)
	{
		const String& name = pair.first;
		if (name == "style")
			continue;

		const Variant& variant = pair.second;
		String value;
		if (variant.GetInto(value))
		{
			content += ' ';
			content += name;
			content += "=\"";
			content += value;
			content += "\"";
		}
	}

	const PropertyMap& local_properties = meta->style.GetLocalStyleProperties();
	if (!local_properties.empty())
		content += " style=\"";

	for (const auto& pair : local_properties)
	{
		const PropertyId id = pair.first;
		const Property& property = pair.second;

		content += StyleSheetSpecification::GetPropertyName(id);
		content += ": ";
		content += StringUtilities::EncodeRml(property.ToString());
		content += "; ";
	}

	if (!local_properties.empty())
		content.back() = '\"';

	if (HasChildNodes())
	{
		content += ">";

		GetInnerRML(content);

		content += "</";
		content += tag;
		content += ">";
	}
	else
	{
		content += " />";
	}
}